

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

bool Geometry::InPoly(Point *p,vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly)

{
  double *pdVar1;
  pointer pPVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  Point b;
  Point a;
  int local_120;
  Point local_f8;
  Point local_e8;
  Point local_d8;
  Point local_c8;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> *local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  Point local_98;
  Line local_88;
  Point local_68;
  Point local_58;
  Point local_48;
  
  lVar9 = 0;
  local_a0 = 0;
  local_120 = 0;
  local_b8 = poly;
  do {
    pPVar2 = (poly->super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(poly->super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 4;
    local_a8 = local_a0;
    if (uVar10 <= local_a0) break;
    pdVar1 = (double *)((long)&pPVar2->x + lVar9);
    local_e8.x = *pdVar1;
    local_e8.y = pdVar1[1];
    local_a0 = local_a0 + 1;
    uVar8 = 0;
    if (local_a0 != uVar10) {
      uVar8 = local_a0;
    }
    local_f8.x = pPVar2[uVar8].x;
    local_f8.y = pPVar2[uVar8].y;
    local_98.x = p->x;
    local_98.y = p->y;
    local_d8.x = local_f8.x;
    local_d8.y = local_f8.y;
    local_c8.x = local_e8.x;
    local_c8.y = local_e8.y;
    Line::Line(&local_88,&local_c8,&local_d8);
    bVar5 = OnLine(&local_98,&local_88);
    Point::~Point(&local_88.b);
    Point::~Point(&local_88.a);
    Point::~Point(&local_d8);
    Point::~Point(&local_c8);
    Point::~Point(&local_98);
    if (!bVar5) {
      local_48.x = local_e8.x;
      local_48.y = local_e8.y;
      local_58.x = p->x;
      local_58.y = p->y;
      local_68.x = local_f8.x;
      local_68.y = local_f8.y;
      local_b0 = lVar9;
      dVar3 = det(&local_48,&local_58,&local_68);
      Point::~Point(&local_68);
      Point::~Point(&local_58);
      Point::~Point(&local_48);
      dVar4 = local_e8.y - p->y;
      iVar6 = (uint)(1e-08 < dVar4) - (uint)(dVar4 < -1e-08);
      dVar4 = local_f8.y - p->y;
      iVar7 = (uint)(1e-08 < dVar4) - (uint)(dVar4 < -1e-08);
      iVar11 = (uint)(1e-08 < dVar3) - (uint)(dVar3 < -1e-08);
      local_120 = (local_120 + (uint)((0 < iVar11 && 0 < iVar7) && iVar6 < 1)) -
                  (uint)((iVar11 < 0 && iVar7 < 1) && 0 < iVar6);
      lVar9 = local_b0;
      poly = local_b8;
    }
    Point::~Point(&local_f8);
    Point::~Point(&local_e8);
    lVar9 = lVar9 + 0x10;
  } while (!bVar5);
  return local_120 != 0 || local_a8 < uVar10;
}

Assistant:

bool InPoly(Point p, std::vector<Point> poly){
		int cnt = 0;
		for(int i = 0; i < poly.size(); i++){
			Point a = poly[i];
			Point b = poly[(i + 1) % poly.size()];
			if(OnLine(p, Line(a, b)))
				return true;
			int x = sgn(det(a, p, b));
			int y = sgn(a.y - p.y);
			int z = sgn(b.y - p.y);
			cnt += (x > 0 && y <= 0 && z > 0);
			cnt -= (x < 0 && z <= 0 && y > 0);
		}
		return cnt;
	}